

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roipooling.cpp
# Opt level: O1

int __thiscall
ncnn::ROIPooling::forward
          (ROIPooling *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  uint uVar5;
  pointer pMVar6;
  Mat *this_00;
  float *pfVar7;
  void *pvVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  ulong local_a8;
  void *local_a0;
  void *local_90;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = pMVar6->w;
  uVar12 = (ulong)(int)uVar3;
  uVar4 = pMVar6->h;
  _c = pMVar6->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar6->elemsize,opt->blob_allocator
             );
  iVar9 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    pfVar7 = (float *)pMVar6[1].data;
    fVar28 = this->spatial_scale;
    fVar25 = roundf(*pfVar7 * fVar28);
    fVar26 = roundf(pfVar7[1] * fVar28);
    fVar27 = roundf(pfVar7[2] * fVar28);
    fVar28 = roundf(fVar28 * pfVar7[3]);
    iVar22 = (int)fVar27 - (int)fVar25;
    iVar9 = 0;
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    iVar13 = (int)fVar28 - (int)fVar26;
    if (iVar13 < 1) {
      iVar13 = 0;
    }
    if (0 < (int)_c) {
      fVar27 = (float)(iVar22 + 1) / (float)this->pooled_width;
      fVar29 = (float)(iVar13 + 1) / (float)this->pooled_height;
      uVar5 = this->pooled_width;
      iVar9 = this->pooled_height;
      fVar28 = (float)(int)fVar26;
      fVar25 = (float)(int)fVar25;
      pvVar8 = pMVar6->data;
      lVar14 = pMVar6->cstep * pMVar6->elemsize;
      local_a8 = 0;
      local_a0 = pvVar8;
      do {
        if (0 < iVar9) {
          local_90 = (void *)(this_00->cstep * local_a8 * this_00->elemsize + (long)this_00->data);
          iVar22 = 0;
          do {
            if (0 < (int)uVar5) {
              fVar26 = floorf((float)iVar22 * fVar29);
              uVar24 = (uint)(fVar26 + fVar28);
              fVar26 = ceilf((float)(iVar22 + 1) * fVar29);
              uVar21 = (uint)(fVar26 + fVar28);
              if ((int)uVar24 < 1) {
                uVar24 = 0;
              }
              uVar10 = uVar24;
              if ((int)uVar4 < (int)uVar24) {
                uVar10 = uVar4;
              }
              if ((int)uVar21 < 1) {
                uVar21 = 0;
              }
              if ((int)uVar4 < (int)uVar21) {
                uVar21 = uVar4;
              }
              uVar15 = (long)(int)uVar4;
              if ((long)(ulong)uVar24 < (long)(int)uVar4) {
                uVar15 = (ulong)uVar24;
              }
              uVar23 = 0;
              do {
                fVar26 = floorf((float)(int)uVar23 * fVar27);
                uVar17 = (uint)(fVar26 + fVar25);
                uVar1 = uVar23 + 1;
                fVar26 = ceilf((float)(int)uVar1 * fVar27);
                uVar11 = (uint)(fVar26 + fVar25);
                if ((int)uVar17 < 1) {
                  uVar17 = 0;
                }
                uVar18 = uVar17;
                if ((int)uVar3 < (int)uVar17) {
                  uVar18 = uVar3;
                }
                if ((int)uVar11 < 1) {
                  uVar11 = 0;
                }
                if ((int)uVar3 < (int)uVar11) {
                  uVar11 = uVar3;
                }
                fVar26 = 0.0;
                if (((int)uVar24 < (int)uVar21) && ((int)uVar17 < (int)uVar11)) {
                  fVar26 = *(float *)((long)pvVar8 +
                                     (long)(int)(uVar10 * uVar3 + uVar18) * 4 + lVar14 * local_a8);
                }
                if ((int)uVar24 < (int)uVar21) {
                  uVar19 = (ulong)uVar17;
                  if ((long)uVar12 <= (long)(ulong)uVar17) {
                    uVar19 = uVar12;
                  }
                  lVar16 = (long)local_a0 + uVar19 * 4 + uVar12 * 4 * uVar15;
                  uVar19 = uVar15;
                  do {
                    if ((int)uVar17 < (int)uVar11) {
                      lVar20 = 0;
                      do {
                        fVar2 = *(float *)(lVar16 + lVar20 * 4);
                        if (fVar26 <= fVar2) {
                          fVar26 = fVar2;
                        }
                        lVar20 = lVar20 + 1;
                      } while (uVar11 - uVar18 != (int)lVar20);
                    }
                    uVar19 = uVar19 + 1;
                    lVar16 = lVar16 + uVar12 * 4;
                  } while (((int)uVar15 + uVar21) - uVar10 != (int)uVar19);
                }
                *(float *)((long)local_90 + uVar23 * 4) = fVar26;
                uVar23 = uVar1;
              } while (uVar1 != uVar5);
            }
            local_90 = (void *)((long)local_90 + (long)(int)uVar5 * 4);
            iVar22 = iVar22 + 1;
          } while (iVar22 != iVar9);
        }
        local_a8 = local_a8 + 1;
        local_a0 = (void *)((long)local_a0 + lVar14);
      } while (local_a8 != _c);
      iVar9 = 0;
    }
  }
  return iVar9;
}

Assistant:

int ROIPooling::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    int roi_x1 = static_cast<int>(round(roi_ptr[0] * spatial_scale));
    int roi_y1 = static_cast<int>(round(roi_ptr[1] * spatial_scale));
    int roi_x2 = static_cast<int>(round(roi_ptr[2] * spatial_scale));
    int roi_y2 = static_cast<int>(round(roi_ptr[3] * spatial_scale));

    int roi_w = std::max(roi_x2 - roi_x1 + 1, 1);
    int roi_h = std::max(roi_y2 - roi_y1 + 1, 1);

    float bin_size_w = (float)roi_w / (float)pooled_width;
    float bin_size_h = (float)roi_h / (float)pooled_height;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        for (int ph = 0; ph < pooled_height; ph++)
        {
            for (int pw = 0; pw < pooled_width; pw++)
            {
                // Compute pooling region for this output unit:
                //  start (included) = floor(ph * roi_height / pooled_height)
                //  end (excluded) = ceil((ph + 1) * roi_height / pooled_height)
                int hstart = static_cast<int>(roi_y1 + floor((float)(ph)*bin_size_h));
                int wstart = static_cast<int>(roi_x1 + floor((float)(pw)*bin_size_w));
                int hend = static_cast<int>(roi_y1 + ceil((float)(ph + 1) * bin_size_h));
                int wend = static_cast<int>(roi_x1 + ceil((float)(pw + 1) * bin_size_w));

                hstart = std::min(std::max(hstart, 0), h);
                wstart = std::min(std::max(wstart, 0), w);
                hend = std::min(std::max(hend, 0), h);
                wend = std::min(std::max(wend, 0), w);

                bool is_empty = (hend <= hstart) || (wend <= wstart);

                float max = is_empty ? 0.f : ptr[hstart * w + wstart];

                for (int y = hstart; y < hend; y++)
                {
                    for (int x = wstart; x < wend; x++)
                    {
                        int index = y * w + x;
                        max = std::max(max, ptr[index]);
                    }
                }

                outptr[pw] = max;
            }

            outptr += pooled_width;
        }
    }

    return 0;
}